

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O0

int arkRootfind(void *arkode_mem)

{
  undefined8 *puVar1;
  bool bVar2;
  undefined4 uVar3;
  long in_RDI;
  double dVar4;
  ARKodeRootMem rootmem;
  ARKodeMem ark_mem;
  int sgnchg;
  int zroot;
  int sideprev;
  int side;
  int imax;
  int retval;
  int i;
  realtype fracsub;
  realtype fracint;
  realtype maxfrac;
  realtype gfrac;
  realtype tmid;
  realtype alpha;
  undefined1 *local_88;
  undefined1 *local_80;
  double local_78;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar5;
  int k;
  int iVar6;
  int iVar7;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar8;
  double local_30;
  double local_20;
  double local_18;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkRootfind","arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    puVar1 = *(undefined8 **)(in_RDI + 0x280);
    iVar7 = 0;
    local_30 = 0.0;
    bVar2 = false;
    iVar5 = 0;
    for (iVar8 = 0; iVar8 < *(int *)(puVar1 + 1); iVar8 = iVar8 + 1) {
      if (*(int *)(puVar1[0xe] + (long)iVar8 * 4) != 0) {
        dVar4 = ABS(*(double *)(puVar1[8] + (long)iVar8 * 8));
        if ((dVar4 != 0.0) || (NAN(dVar4))) {
          if ((*(double *)(puVar1[7] + (long)iVar8 * 8) * *(double *)(puVar1[8] + (long)iVar8 * 8) <
               0.0) && (((double)*(int *)(puVar1[3] + (long)iVar8 * 4) *
                         *(double *)(puVar1[7] + (long)iVar8 * 8) <= 0.0 &&
                        (dVar4 = ABS(*(double *)(puVar1[8] + (long)iVar8 * 8) /
                                     (*(double *)(puVar1[8] + (long)iVar8 * 8) -
                                     *(double *)(puVar1[7] + (long)iVar8 * 8))), local_30 < dVar4)))
             ) {
            iVar5 = 1;
            iVar7 = iVar8;
            local_30 = dVar4;
          }
        }
        else if ((double)*(int *)(puVar1[3] + (long)iVar8 * 4) *
                 *(double *)(puVar1[7] + (long)iVar8 * 8) <= 0.0) {
          bVar2 = true;
        }
      }
    }
    if (iVar5 != 0) {
      local_18 = 1.0;
      iVar6 = 0;
      k = -1;
      while( true ) {
        while( true ) {
          if (ABS((double)puVar1[5] - (double)puVar1[4]) <= (double)puVar1[0xb]) goto LAB_0115c388;
          if (k == iVar6) {
            if (iVar6 == 2) {
              local_78 = local_18 * 2.0;
            }
            else {
              local_78 = local_18 * 0.5;
            }
            local_18 = local_78;
          }
          else {
            local_18 = 1.0;
          }
          local_20 = (double)puVar1[5] -
                     (((double)puVar1[5] - (double)puVar1[4]) *
                     *(double *)(puVar1[8] + (long)iVar7 * 8)) /
                     (-local_18 * *(double *)(puVar1[7] + (long)iVar7 * 8) +
                     *(double *)(puVar1[8] + (long)iVar7 * 8));
          if (ABS(local_20 - (double)puVar1[4]) < (double)puVar1[0xb] * 0.5) {
            dVar4 = ABS((double)puVar1[5] - (double)puVar1[4]) / (double)puVar1[0xb];
            if (dVar4 <= 5.0) {
              local_80 = (undefined1 *)(0.5 / dVar4);
            }
            else {
              local_80 = &DAT_3fb999999999999a;
            }
            local_20 = (double)local_80 * ((double)puVar1[5] - (double)puVar1[4]) +
                       (double)puVar1[4];
          }
          if (ABS((double)puVar1[5] - local_20) < (double)puVar1[0xb] * 0.5) {
            dVar4 = ABS((double)puVar1[5] - (double)puVar1[4]) / (double)puVar1[0xb];
            if (dVar4 <= 5.0) {
              local_88 = (undefined1 *)(0.5 / dVar4);
            }
            else {
              local_88 = &DAT_3fb999999999999a;
            }
            local_20 = -(double)local_88 * ((double)puVar1[5] - (double)puVar1[4]) +
                       (double)puVar1[5];
          }
          arkGetDky((ARKodeMem)CONCAT44(iVar8,in_stack_ffffffffffffffb8),
                    (realtype)CONCAT44(iVar7,iVar6),k,
                    (N_Vector)CONCAT44(iVar5,in_stack_ffffffffffffffa0));
          k = iVar6;
          iVar8 = (*(code *)*puVar1)(local_20,*(undefined8 *)(in_RDI + 0x108),puVar1[9],puVar1[0x10]
                                    );
          puVar1[0xd] = puVar1[0xd] + 1;
          if (iVar8 != 0) {
            return -0xc;
          }
          local_30 = 0.0;
          bVar2 = false;
          iVar5 = 0;
          for (iVar8 = 0; iVar8 < *(int *)(puVar1 + 1); iVar8 = iVar8 + 1) {
            if (*(int *)(puVar1[0xe] + (long)iVar8 * 4) != 0) {
              dVar4 = ABS(*(double *)(puVar1[9] + (long)iVar8 * 8));
              if ((dVar4 != 0.0) || (NAN(dVar4))) {
                if ((*(double *)(puVar1[7] + (long)iVar8 * 8) *
                     *(double *)(puVar1[9] + (long)iVar8 * 8) < 0.0) &&
                   (((double)*(int *)(puVar1[3] + (long)iVar8 * 4) *
                     *(double *)(puVar1[7] + (long)iVar8 * 8) <= 0.0 &&
                    (dVar4 = ABS(*(double *)(puVar1[9] + (long)iVar8 * 8) /
                                 (*(double *)(puVar1[9] + (long)iVar8 * 8) -
                                 *(double *)(puVar1[7] + (long)iVar8 * 8))), local_30 < dVar4)))) {
                  iVar5 = 1;
                  iVar7 = iVar8;
                  local_30 = dVar4;
                }
              }
              else if ((double)*(int *)(puVar1[3] + (long)iVar8 * 4) *
                       *(double *)(puVar1[7] + (long)iVar8 * 8) <= 0.0) {
                bVar2 = true;
              }
            }
          }
          in_stack_ffffffffffffffb8 = 0;
          if (iVar5 == 0) break;
          puVar1[5] = local_20;
          for (iVar8 = 0; iVar8 < *(int *)(puVar1 + 1); iVar8 = iVar8 + 1) {
            *(undefined8 *)(puVar1[8] + (long)iVar8 * 8) =
                 *(undefined8 *)(puVar1[9] + (long)iVar8 * 8);
          }
          iVar6 = 1;
          if (ABS((double)puVar1[5] - (double)puVar1[4]) <= (double)puVar1[0xb]) goto LAB_0115c388;
        }
        if (bVar2) break;
        puVar1[4] = local_20;
        for (iVar8 = 0; iVar8 < *(int *)(puVar1 + 1); iVar8 = iVar8 + 1) {
          *(undefined8 *)(puVar1[7] + (long)iVar8 * 8) =
               *(undefined8 *)(puVar1[9] + (long)iVar8 * 8);
        }
        iVar6 = 2;
        if (ABS((double)puVar1[5] - (double)puVar1[4]) <= (double)puVar1[0xb]) goto LAB_0115c388;
      }
      puVar1[5] = local_20;
      for (iVar7 = 0; iVar7 < *(int *)(puVar1 + 1); iVar7 = iVar7 + 1) {
        *(undefined8 *)(puVar1[8] + (long)iVar7 * 8) = *(undefined8 *)(puVar1[9] + (long)iVar7 * 8);
      }
LAB_0115c388:
      puVar1[6] = puVar1[5];
      for (iVar7 = 0; iVar7 < *(int *)(puVar1 + 1); iVar7 = iVar7 + 1) {
        *(undefined8 *)(puVar1[9] + (long)iVar7 * 8) = *(undefined8 *)(puVar1[8] + (long)iVar7 * 8);
        *(undefined4 *)(puVar1[2] + (long)iVar7 * 4) = 0;
        if (*(int *)(puVar1[0xe] + (long)iVar7 * 4) != 0) {
          dVar4 = ABS(*(double *)(puVar1[8] + (long)iVar7 * 8));
          if (((dVar4 == 0.0) && (!NAN(dVar4))) &&
             ((double)*(int *)(puVar1[3] + (long)iVar7 * 4) *
              *(double *)(puVar1[7] + (long)iVar7 * 8) <= 0.0)) {
            uVar3 = 1;
            if (0.0 < *(double *)(puVar1[7] + (long)iVar7 * 8)) {
              uVar3 = 0xffffffff;
            }
            *(undefined4 *)(puVar1[2] + (long)iVar7 * 4) = uVar3;
          }
          if ((*(double *)(puVar1[7] + (long)iVar7 * 8) * *(double *)(puVar1[8] + (long)iVar7 * 8) <
               0.0) && ((double)*(int *)(puVar1[3] + (long)iVar7 * 4) *
                        *(double *)(puVar1[7] + (long)iVar7 * 8) <= 0.0)) {
            uVar3 = 1;
            if (0.0 < *(double *)(puVar1[7] + (long)iVar7 * 8)) {
              uVar3 = 0xffffffff;
            }
            *(undefined4 *)(puVar1[2] + (long)iVar7 * 4) = uVar3;
          }
        }
      }
      return 1;
    }
    puVar1[6] = puVar1[5];
    for (iVar7 = 0; iVar7 < *(int *)(puVar1 + 1); iVar7 = iVar7 + 1) {
      *(undefined8 *)(puVar1[9] + (long)iVar7 * 8) = *(undefined8 *)(puVar1[8] + (long)iVar7 * 8);
    }
    if (bVar2) {
      for (iVar7 = 0; iVar7 < *(int *)(puVar1 + 1); iVar7 = iVar7 + 1) {
        *(undefined4 *)(puVar1[2] + (long)iVar7 * 4) = 0;
        if (((*(int *)(puVar1[0xe] + (long)iVar7 * 4) != 0) &&
            (dVar4 = ABS(*(double *)(puVar1[8] + (long)iVar7 * 8)), dVar4 == 0.0)) && (!NAN(dVar4)))
        {
          uVar3 = 1;
          if (0.0 < *(double *)(puVar1[7] + (long)iVar7 * 8)) {
            uVar3 = 0xffffffff;
          }
          *(undefined4 *)(puVar1[2] + (long)iVar7 * 4) = uVar3;
        }
      }
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int arkRootfind(void* arkode_mem)
{
  realtype alpha, tmid, gfrac, maxfrac, fracint, fracsub;
  int i, retval, imax, side, sideprev;
  booleantype zroot, sgnchg;
  ARKodeMem ark_mem;
  ARKodeRootMem rootmem;
  if (arkode_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkRootfind", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  rootmem = ark_mem->root_mem;

  imax = 0;

  /* First check for change in sign in ghi or for a zero in ghi. */
  maxfrac = ZERO;
  zroot = SUNFALSE;
  sgnchg = SUNFALSE;
  for (i = 0;  i < rootmem->nrtfn; i++) {
    if (!rootmem->gactive[i]) continue;
    if (SUNRabs(rootmem->ghi[i]) == ZERO) {
      if (rootmem->rootdir[i]*rootmem->glo[i] <= ZERO) {
        zroot = SUNTRUE;
      }
    } else {
      if ( (rootmem->glo[i]*rootmem->ghi[i] < ZERO) &&
           (rootmem->rootdir[i]*rootmem->glo[i] <= ZERO) ) {
        gfrac = SUNRabs(rootmem->ghi[i]/(rootmem->ghi[i] - rootmem->glo[i]));
        if (gfrac > maxfrac) {
          sgnchg = SUNTRUE;
          maxfrac = gfrac;
          imax = i;
        }
      }
    }
  }

  /* If no sign change was found, reset trout and grout.  Then return
     ARK_SUCCESS if no zero was found, or set iroots and return RTFOUND.  */
  if (!sgnchg) {
    rootmem->trout = rootmem->thi;
    for (i = 0; i < rootmem->nrtfn; i++)
      rootmem->grout[i] = rootmem->ghi[i];
    if (!zroot) return(ARK_SUCCESS);
    for (i = 0; i < rootmem->nrtfn; i++) {
      rootmem->iroots[i] = 0;
      if (!rootmem->gactive[i]) continue;
      if (SUNRabs(rootmem->ghi[i]) == ZERO)
        rootmem->iroots[i] = rootmem->glo[i] > 0 ? -1:1;
    }
    return(RTFOUND);
  }

  /* Initialize alpha to avoid compiler warning */
  alpha = ONE;

  /* A sign change was found.  Loop to locate nearest root. */
  side = 0;  sideprev = -1;
  for(;;) {                                    /* Looping point */

    /* If interval size is already less than tolerance ttol, break. */
    if (SUNRabs(rootmem->thi - rootmem->tlo) <= rootmem->ttol) break;

    /* Set weight alpha.
       On the first two passes, set alpha = 1.  Thereafter, reset alpha
       according to the side (low vs high) of the subinterval in which
       the sign change was found in the previous two passes.
       If the sides were opposite, set alpha = 1.
       If the sides were the same, then double alpha (if high side),
       or halve alpha (if low side).
       The next guess tmid is the secant method value if alpha = 1, but
       is closer to tlo if alpha < 1, and closer to thi if alpha > 1.    */
    if (sideprev == side) {
      alpha = (side == 2) ? alpha*TWO : alpha*HALF;
    } else {
      alpha = ONE;
    }

    /* Set next root approximation tmid and get g(tmid).
       If tmid is too close to tlo or thi, adjust it inward,
       by a fractional distance that is between 0.1 and 0.5.  */
    tmid = rootmem->thi - (rootmem->thi - rootmem->tlo) *
      rootmem->ghi[imax]/(rootmem->ghi[imax] - alpha*rootmem->glo[imax]);
    if (SUNRabs(tmid - rootmem->tlo) < HALF*rootmem->ttol) {
      fracint = SUNRabs(rootmem->thi - rootmem->tlo)/rootmem->ttol;
      fracsub = (fracint > FIVE) ? TENTH : HALF/fracint;
      tmid = rootmem->tlo + fracsub*(rootmem->thi - rootmem->tlo);
    }
    if (SUNRabs(rootmem->thi - tmid) < HALF*rootmem->ttol) {
      fracint = SUNRabs(rootmem->thi - rootmem->tlo)/rootmem->ttol;
      fracsub = (fracint > FIVE) ? TENTH : HALF/fracint;
      tmid = rootmem->thi - fracsub*(rootmem->thi - rootmem->tlo);
    }

    (void) arkGetDky(ark_mem, tmid, 0, ark_mem->ycur);
    retval = rootmem->gfun(tmid, ark_mem->ycur, rootmem->grout,
                           rootmem->root_data);
    rootmem->nge++;
    if (retval != 0) return(ARK_RTFUNC_FAIL);

    /* Check to see in which subinterval g changes sign, and reset imax.
       Set side = 1 if sign change is on low side, or 2 if on high side.  */
    maxfrac = ZERO;
    zroot = SUNFALSE;
    sgnchg = SUNFALSE;
    sideprev = side;
    for (i = 0;  i < rootmem->nrtfn; i++) {
      if (!rootmem->gactive[i]) continue;
      if (SUNRabs(rootmem->grout[i]) == ZERO) {
        if (rootmem->rootdir[i]*rootmem->glo[i] <= ZERO) {
          zroot = SUNTRUE;
        }
      } else {
        if ( (rootmem->glo[i]*rootmem->grout[i] < ZERO) &&
             (rootmem->rootdir[i]*rootmem->glo[i] <= ZERO) ) {
          gfrac = SUNRabs(rootmem->grout[i]/(rootmem->grout[i] - rootmem->glo[i]));
          if (gfrac > maxfrac) {
            sgnchg = SUNTRUE;
            maxfrac = gfrac;
            imax = i;
          }
        }
      }
    }
    if (sgnchg) {
      /* Sign change found in (tlo,tmid); replace thi with tmid. */
      rootmem->thi = tmid;
      for (i = 0; i < rootmem->nrtfn; i++)
        rootmem->ghi[i] = rootmem->grout[i];
      side = 1;
      /* Stop at root thi if converged; otherwise loop. */
      if (SUNRabs(rootmem->thi - rootmem->tlo) <= rootmem->ttol) break;
      continue;  /* Return to looping point. */
    }

    if (zroot) {
      /* No sign change in (tlo,tmid), but g = 0 at tmid; return root tmid. */
      rootmem->thi = tmid;
      for (i = 0; i < rootmem->nrtfn; i++)
        rootmem->ghi[i] = rootmem->grout[i];
      break;
    }

    /* No sign change in (tlo,tmid), and no zero at tmid.
       Sign change must be in (tmid,thi).  Replace tlo with tmid. */
    rootmem->tlo = tmid;
    for (i = 0; i < rootmem->nrtfn; i++)
      rootmem->glo[i] = rootmem->grout[i];
    side = 2;
    /* Stop at root thi if converged; otherwise loop back. */
    if (SUNRabs(rootmem->thi - rootmem->tlo) <= rootmem->ttol)
      break;

  } /* End of root-search loop */

  /* Reset trout and grout, set iroots, and return RTFOUND. */
  rootmem->trout = rootmem->thi;
  for (i = 0; i < rootmem->nrtfn; i++) {
    rootmem->grout[i] = rootmem->ghi[i];
    rootmem->iroots[i] = 0;
    if (!rootmem->gactive[i]) continue;
    if ( (SUNRabs(rootmem->ghi[i]) == ZERO) &&
         (rootmem->rootdir[i]*rootmem->glo[i] <= ZERO) )
      rootmem->iroots[i] = rootmem->glo[i] > 0 ? -1:1;
    if ( (rootmem->glo[i]*rootmem->ghi[i] < ZERO) &&
         (rootmem->rootdir[i]*rootmem->glo[i] <= ZERO) )
      rootmem->iroots[i] = rootmem->glo[i] > 0 ? -1:1;
  }
  return(RTFOUND);
}